

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_140e07f::AutoFileDescriptor::AutoFileDescriptor
          (AutoFileDescriptor *this,QString *path,int mode)

{
  int iVar1;
  int *piVar2;
  char *__file;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLocal8Bit((QByteArray *)&QStack_38,path);
  __file = QStack_38.ptr;
  if (QStack_38.ptr == (char *)0x0) {
    __file = &QByteArray::_empty;
  }
  do {
    iVar1 = open64(__file,0x80000,0x1ff);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
  this->fd = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AutoFileDescriptor(const QString &path, int mode = QT_OPEN_RDONLY)
        : fd(qt_safe_open(QFile::encodeName(path), mode))
    {}